

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_find_best_partitioning.cpp
# Opt level: O1

uint find_best_partition_candidates
               (block_size_descriptor *bsd,image_block *blk,uint partition_count,
               uint partition_search_limit,uint *best_partitions,uint requested_candidates)

{
  char *pcVar1;
  float *pfVar2;
  byte bVar3;
  byte bVar4;
  short sVar5;
  ushort uVar6;
  float fVar7;
  __m128 afVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  block_size_descriptor *this;
  processed_line4 pVar19;
  uint i;
  uint uVar20;
  undefined4 uVar21;
  ulong uVar22;
  byte *pbVar23;
  partition_info *ppVar24;
  long lVar25;
  short sVar26;
  uint uVar27;
  uint uVar28;
  undefined4 in_register_0000000c;
  ulong uVar29;
  bool bVar30;
  uint uVar31;
  uint uVar32;
  undefined4 in_register_00000014;
  long lVar33;
  ulong uVar34;
  uint64_t *puVar35;
  uint uVar36;
  partition_metrics *pm;
  undefined1 (*pauVar37) [16];
  partition_metrics *pm_00;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  uint8_t *puVar45;
  uint i_2;
  int iVar46;
  ulong uVar47;
  bool bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  float fVar75;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  float fVar76;
  float fVar77;
  float fVar81;
  float fVar83;
  float fVar84;
  undefined1 auVar78 [16];
  float fVar82;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  uint16_t mscount [64];
  float line_lengths [4];
  uint64_t bitmaps [4];
  vfloat4 cluster_centers [4];
  uint samec_best_partitions [8];
  float samec_best_errors [8];
  uint uncor_best_partitions [8];
  float uncor_best_errors [8];
  uint interleave [16];
  uint64_t bitmasks [16];
  uint16_t partition_sequence [1024];
  float local_fd4;
  undefined8 local_fd0;
  float local_fc4;
  ulong local_fc0;
  ulong local_fb8;
  ulong local_fb0;
  ulong local_fa8;
  uint local_f9c;
  block_size_descriptor *local_f98;
  ulong local_f90;
  uint *local_f88;
  ulong local_f80;
  ulong local_f78;
  ulong local_f70;
  ulong local_f68;
  ulong local_f60;
  long local_f58;
  long local_f50;
  long local_f48;
  long local_f40;
  long local_f38;
  long local_f30;
  undefined1 local_f28 [8];
  undefined8 uStack_f20;
  float afStack_f18 [2];
  undefined8 uStack_f10;
  undefined1 local_f08 [32];
  undefined1 local_ee8 [32];
  undefined1 local_ec8 [32];
  float local_ea8 [2];
  undefined8 uStack_ea0;
  processed_line4 local_e98 [3];
  undefined1 auStack_e28 [16];
  undefined1 local_e18 [8];
  float afStack_e10 [2];
  undefined8 auStack_e08 [14];
  uint local_d98 [8];
  float local_d78 [8];
  uint local_d58 [8];
  float local_d38 [4];
  undefined8 auStack_d28 [2];
  partition_metrics local_d18 [6];
  undefined8 auStack_c48 [2];
  undefined1 local_c38 [8];
  undefined8 uStack_c30;
  float afStack_c28 [2];
  undefined8 uStack_c20;
  line3 local_c18;
  processed_line3 local_bf8;
  processed_line3 local_bd8;
  float afStack_bb8 [224];
  undefined8 local_838;
  float afStack_830 [512];
  
  local_fd0 = CONCAT44(in_register_00000014,partition_count);
  local_fa8 = CONCAT44(in_register_0000000c,partition_search_limit);
  bVar3 = bsd->texel_count;
  uVar29 = (ulong)bVar3;
  if (uVar29 < 0x15) {
    fVar51 = 0.03;
  }
  else if (bVar3 < 0x20) {
    fVar51 = 0.04;
  }
  else {
    fVar51 = *(float *)(&DAT_00332858 + (ulong)(bVar3 < 0x2a) * 4);
  }
  local_f9c = requested_candidates;
  if (partition_count == 0) {
    __assert_fail("partition_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                  ,0x240,
                  "unsigned int find_best_partition_candidates(const block_size_descriptor &, const image_block &, unsigned int, unsigned int, unsigned int *, unsigned int)"
                 );
  }
  local_f98 = bsd;
  local_f88 = best_partitions;
  if (partition_search_limit == 0) {
    __assert_fail("partition_search_limit > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                  ,0x241,
                  "unsigned int find_best_partition_candidates(const block_size_descriptor &, const image_block &, unsigned int, unsigned int, unsigned int *, unsigned int)"
                 );
  }
  uVar39 = (ulong)partition_count;
  fVar7 = (blk->channel_weight).m[0];
  fVar75 = (blk->channel_weight).m[1];
  fVar82 = (blk->channel_weight).m[2];
  fVar77 = (blk->channel_weight).m[3];
  uVar40 = 2;
  if (2 < partition_count) {
    uVar40 = (ulong)partition_count;
  }
  iVar42 = 0;
  do {
    if (iVar42 == 0) {
      uVar38 = (uint)bVar3;
      if (uVar38 == 0) {
        __assert_fail("texel_count > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                      ,0x42,
                      "void kmeans_init(const image_block &, unsigned int, unsigned int, vfloat4 *)"
                     );
      }
      uVar22 = 0x239e9 % (ulong)uVar38;
      auVar50 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar22]),ZEXT416((uint)blk->data_g[uVar22]),
                              0x10);
      auVar50 = vinsertps_avx(auVar50,ZEXT416((uint)blk->data_b[uVar22]),0x20);
      afVar8 = (__m128)vinsertps_avx(auVar50,ZEXT416((uint)blk->data_a[uVar22]),0x30);
      local_e18._0_4_ = afVar8[0];
      local_e18._4_4_ = afVar8[1];
      afStack_e10[0] = afVar8[2];
      afStack_e10[1] = afVar8[3];
      fVar81 = 0.0;
      uVar22 = 0;
      do {
        auVar50 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar22]),
                                ZEXT416((uint)blk->data_g[uVar22]),0x10);
        auVar50 = vinsertps_avx(auVar50,ZEXT416((uint)blk->data_b[uVar22]),0x20);
        auVar50 = vinsertps_avx(auVar50,ZEXT416((uint)blk->data_a[uVar22]),0x30);
        auVar50 = vsubps_avx(auVar50,(undefined1  [16])afVar8);
        auVar52._0_4_ = fVar7 * auVar50._0_4_ * auVar50._0_4_;
        auVar52._4_4_ = fVar75 * auVar50._4_4_ * auVar50._4_4_;
        auVar52._8_4_ = fVar82 * auVar50._8_4_ * auVar50._8_4_;
        auVar52._12_4_ = fVar77 * auVar50._12_4_ * auVar50._12_4_;
        auVar50 = vshufpd_avx(auVar52,auVar52,1);
        auVar86._0_4_ = auVar52._0_4_ + auVar50._0_4_;
        auVar86._4_4_ = auVar52._4_4_ + auVar50._4_4_;
        auVar86._8_4_ = auVar52._8_4_ + auVar50._8_4_;
        auVar86._12_4_ = auVar52._12_4_ + auVar50._12_4_;
        auVar50 = vhaddps_avx(auVar86,auVar86);
        fVar81 = fVar81 + auVar50._0_4_;
        *(float *)((long)&local_838 + uVar22 * 4) = auVar50._0_4_;
        uVar22 = uVar22 + 1;
      } while (uVar29 != uVar22);
      uVar22 = 1;
      uVar31 = partition_count * 3 - 6;
      do {
        uVar34 = (ulong)uVar31;
        uVar31 = uVar31 + 1;
        fVar83 = 0.0;
        uVar47 = 0;
        do {
          fVar83 = fVar83 + *(float *)((long)&local_838 + uVar47 * 4);
          if (fVar81 * *(float *)(&DAT_00332c80 + uVar34 * 4) <= fVar83) goto LAB_002710b5;
          uVar47 = uVar47 + 1;
        } while (uVar29 != uVar47);
        uVar47 = (ulong)uVar38;
LAB_002710b5:
        uVar34 = uVar47 & 0xffffffff;
        if (bVar3 - 1 <= (uint)uVar47) {
          uVar34 = (ulong)(bVar3 - 1);
        }
        auVar50 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar34]),
                                ZEXT416((uint)blk->data_g[uVar34]),0x10);
        auVar50 = vinsertps_avx(auVar50,ZEXT416((uint)blk->data_b[uVar34]),0x20);
        auVar50 = vinsertps_avx(auVar50,ZEXT416((uint)blk->data_a[uVar34]),0x30);
        uVar34 = uVar22 + 1;
        *(undefined1 (*) [16])(local_e18 + uVar22 * 0x10) = auVar50;
        if (uVar34 < uVar39) {
          fVar81 = 0.0;
          uVar22 = 0;
          do {
            auVar52 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar22]),
                                    ZEXT416((uint)blk->data_g[uVar22]),0x10);
            auVar52 = vinsertps_avx(auVar52,ZEXT416((uint)blk->data_b[uVar22]),0x20);
            auVar52 = vinsertps_avx(auVar52,ZEXT416((uint)blk->data_a[uVar22]),0x30);
            auVar52 = vsubps_avx(auVar52,auVar50);
            auVar87._0_4_ = fVar7 * auVar52._0_4_ * auVar52._0_4_;
            auVar87._4_4_ = fVar75 * auVar52._4_4_ * auVar52._4_4_;
            auVar87._8_4_ = fVar82 * auVar52._8_4_ * auVar52._8_4_;
            auVar87._12_4_ = fVar77 * auVar52._12_4_ * auVar52._12_4_;
            auVar52 = vshufpd_avx(auVar87,auVar87,1);
            auVar88._0_4_ = auVar87._0_4_ + auVar52._0_4_;
            auVar88._4_4_ = auVar87._4_4_ + auVar52._4_4_;
            auVar88._8_4_ = auVar87._8_4_ + auVar52._8_4_;
            auVar88._12_4_ = auVar87._12_4_ + auVar52._12_4_;
            auVar52 = vhaddps_avx(auVar88,auVar88);
            auVar52 = vminss_avx(auVar52,ZEXT416(*(uint *)((long)&local_838 + uVar22 * 4)));
            fVar81 = fVar81 + auVar52._0_4_;
            *(float *)((long)&local_838 + uVar22 * 4) = auVar52._0_4_;
            uVar22 = uVar22 + 1;
          } while (uVar29 != uVar22);
        }
        uVar22 = uVar34;
      } while (uVar34 != uVar40);
    }
    else {
      if (uVar29 == 0) {
        __assert_fail("texel_count > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                      ,0xd9,
                      "void kmeans_update(const image_block &, unsigned int, unsigned int, vfloat4 *, const uint8_t *)"
                     );
      }
      afStack_830[6] = 0.0;
      afStack_830[7] = 0.0;
      afStack_830[8] = 0.0;
      afStack_830[9] = 0.0;
      afStack_830[10] = 0.0;
      afStack_830[0xb] = 0.0;
      afStack_830[0xc] = 0.0;
      afStack_830[0xd] = 0.0;
      local_838 = 0;
      afStack_830[0] = 0.0;
      afStack_830[1] = 0.0;
      afStack_830[2] = 0.0;
      afStack_830[3] = 0.0;
      afStack_830[4] = 0.0;
      afStack_830[5] = 0.0;
      auVar9._28_4_ = 0;
      auVar9._0_28_ = stack0xfffffffffffff3cc;
      _local_c38 = (line3)(auVar9 << 0x20);
      uVar22 = 0;
      do {
        auVar50 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar22]),
                                ZEXT416((uint)blk->data_g[uVar22]),0x10);
        auVar50 = vinsertps_avx(auVar50,ZEXT416((uint)blk->data_b[uVar22]),0x20);
        auVar50 = vinsertps_avx(auVar50,ZEXT416((uint)blk->data_a[uVar22]),0x30);
        bVar4 = *(byte *)((long)local_d18[0].avg.m + uVar22);
        local_c38[bVar4] = local_c38[bVar4] + '\x01';
        uVar34 = (ulong)bVar4;
        fVar81 = *(float *)((long)&local_838 + uVar34 * 0x10 + 4);
        fVar83 = afStack_830[uVar34 * 4];
        fVar84 = afStack_830[uVar34 * 4 + 1];
        *(float *)(&local_838 + uVar34 * 2) = auVar50._0_4_ + *(float *)(&local_838 + uVar34 * 2);
        *(float *)((long)&local_838 + uVar34 * 0x10 + 4) = auVar50._4_4_ + fVar81;
        afStack_830[uVar34 * 4] = auVar50._8_4_ + fVar83;
        afStack_830[uVar34 * 4 + 1] = auVar50._12_4_ + fVar84;
        uVar22 = uVar22 + 1;
      } while (uVar29 != uVar22);
      lVar33 = 0;
      pbVar23 = local_c38;
      do {
        fVar76 = 1.0 / (float)*pbVar23;
        fVar81 = *(float *)((long)&local_838 + lVar33 + 4);
        fVar83 = *(float *)((long)afStack_830 + lVar33);
        fVar84 = *(float *)((long)afStack_830 + lVar33 + 4);
        *(float *)(local_e18 + lVar33) = fVar76 * *(float *)((long)&local_838 + lVar33);
        *(float *)(local_e18 + lVar33 + 4) = fVar76 * fVar81;
        *(float *)((long)afStack_e10 + lVar33) = fVar76 * fVar83;
        *(float *)((long)auStack_e08 + lVar33 + -4) = fVar76 * fVar84;
        lVar33 = lVar33 + 0x10;
        pbVar23 = pbVar23 + 1;
      } while (uVar39 << 4 != lVar33);
    }
    if (bVar3 == 0) {
      __assert_fail("texel_count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                    ,0x99,
                    "void kmeans_assign(const image_block &, unsigned int, unsigned int, const vfloat4 *, uint8_t *)"
                   );
    }
    local_838 = local_838 & 0xffffffff00000000;
    uVar22 = 0;
    do {
      auVar50 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar22]),ZEXT416((uint)blk->data_g[uVar22]),
                              0x10);
      auVar50 = vinsertps_avx(auVar50,ZEXT416((uint)blk->data_b[uVar22]),0x20);
      auVar50 = vinsertps_avx(auVar50,ZEXT416((uint)blk->data_a[uVar22]),0x30);
      uVar47 = 0;
      auVar52 = SUB6416(ZEXT464(0x7f7fffff),0);
      uVar34 = 0;
      pauVar37 = (undefined1 (*) [16])local_e18;
      do {
        auVar86 = vsubps_avx(auVar50,*pauVar37);
        auVar89._0_4_ = fVar7 * auVar86._0_4_ * auVar86._0_4_;
        auVar89._4_4_ = fVar75 * auVar86._4_4_ * auVar86._4_4_;
        auVar89._8_4_ = fVar82 * auVar86._8_4_ * auVar86._8_4_;
        auVar89._12_4_ = fVar77 * auVar86._12_4_ * auVar86._12_4_;
        auVar86 = vshufpd_avx(auVar89,auVar89,1);
        auVar90._0_4_ = auVar89._0_4_ + auVar86._0_4_;
        auVar90._4_4_ = auVar89._4_4_ + auVar86._4_4_;
        auVar90._8_4_ = auVar89._8_4_ + auVar86._8_4_;
        auVar90._12_4_ = auVar89._12_4_ + auVar86._12_4_;
        auVar86 = vhaddps_avx(auVar90,auVar90);
        if (auVar86._0_4_ < auVar52._0_4_) {
          uVar34 = uVar47 & 0xffffffff;
        }
        auVar52 = vminss_avx(auVar86,auVar52);
        uVar47 = uVar47 + 1;
        pauVar37 = pauVar37 + 1;
      } while (uVar39 != uVar47);
      *(char *)((long)&local_838 + uVar34) = *(char *)((long)&local_838 + uVar34) + '\x01';
      *(char *)((long)local_d18[0].avg.m + uVar22) = (char)uVar34;
      uVar22 = uVar22 + 1;
    } while (uVar22 != uVar29);
    uVar22 = 0;
    bVar48 = false;
    do {
      do {
        bVar30 = bVar48;
        if (*(char *)((long)&local_838 + uVar22) == '\0') {
          pcVar1 = (char *)((long)&local_838 + (ulong)*(byte *)((long)local_d18[0].avg.m + uVar22));
          *pcVar1 = *pcVar1 + -1;
          *(char *)((long)&local_838 + uVar22) = *(char *)((long)&local_838 + uVar22) + '\x01';
          *(char *)((long)local_d18[0].avg.m + uVar22) = (char)uVar22;
          bVar30 = true;
        }
        uVar22 = uVar22 + 1;
        bVar48 = bVar30;
      } while (uVar22 != uVar39);
      uVar22 = 0;
      bVar48 = false;
    } while (bVar30);
    iVar42 = iVar42 + 1;
    if (iVar42 == 3) {
      local_e98[0] = (processed_line4)(ZEXT1232(ZEXT812(0)) << 0x20);
      local_f80 = 0x40;
      if (bVar3 < 0x40) {
        local_f80 = (ulong)(uint)bVar3;
      }
      uVar29 = 0;
      do {
        pfVar2 = local_e98[0].amod.m +
                 (ulong)*(byte *)((long)local_d18[0].avg.m + (ulong)bsd->kmeans_texels[uVar29]) * 2;
        *(ulong *)pfVar2 = *(ulong *)pfVar2 | 1L << ((byte)uVar29 & 0x3f);
        pVar19 = local_e98[0];
        uVar29 = uVar29 + 1;
      } while (local_f80 != uVar29);
      uVar38 = bsd->partitioning_count_selected[partition_count - 1];
      uVar29 = (ulong)uVar38;
      if (uVar29 != 0) {
        if (uVar39 == 2) {
          puVar35 = bsd->coverage_bitmaps_2[0] + 1;
          uVar39 = 0;
          do {
            uVar27 = (int)POPCOUNT(*puVar35 ^ local_e98[0].amod.m._8_8_) +
                     (int)POPCOUNT((*(uint64_t (*) [2])(puVar35 + -1))[0] ^
                                   local_e98[0].amod.m._0_8_);
            uVar31 = (int)POPCOUNT((*(uint64_t (*) [2])(puVar35 + -1))[0] ^
                                   local_e98[0].amod.m._8_8_) +
                     (int)POPCOUNT(*puVar35 ^ local_e98[0].amod.m._0_8_);
            if (uVar27 < uVar31) {
              uVar31 = uVar27;
            }
            bVar4 = (byte)(uVar31 >> 1);
            local_c38[uVar39] = bVar4;
            if (0x7f < uVar31) {
              __assert_fail("mismatch_counts[i] < BLOCK_MAX_KMEANS_TEXELS",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                            ,0x17b,
                            "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                           );
            }
            if (bVar3 <= bVar4) {
              __assert_fail("mismatch_counts[i] < bsd.texel_count",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                            ,0x17c,
                            "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                           );
            }
            uVar39 = uVar39 + 1;
            puVar35 = puVar35 + 2;
          } while (uVar29 != uVar39);
        }
        else {
          local_fb0 = uVar29;
          if (partition_count == 3) {
            local_fb8._0_4_ = (uint)local_e98[0].amod.m[0];
            local_fb8._4_4_ = local_e98[0].amod.m[1];
            local_fc0._0_4_ = (int)local_e98[0].amod.m[2];
            local_fc0._4_4_ = local_e98[0].amod.m[3];
            local_f90._0_4_ = (int)local_e98[0].bs.m[0];
            local_f90._4_4_ = local_e98[0].bs.m[1];
            puVar35 = bsd->coverage_bitmaps_3[0] + 2;
            uVar39 = 0;
            do {
              uVar40 = (*(uint64_t (*) [3])(puVar35 + -2))[0];
              uVar22 = puVar35[-1];
              uVar34 = *puVar35;
              iVar42 = (int)POPCOUNT(uVar34 ^ local_e98[0].bs.m._0_8_);
              iVar12 = (int)POPCOUNT(uVar22 ^ local_e98[0].amod.m._8_8_);
              uVar27 = iVar42 + iVar12;
              iVar13 = (int)POPCOUNT(uVar34 ^ local_e98[0].amod.m._8_8_);
              iVar44 = (int)POPCOUNT(uVar22 ^ local_e98[0].bs.m._0_8_);
              uVar31 = iVar13 + iVar44;
              if (uVar27 < uVar31) {
                uVar31 = uVar27;
              }
              uVar31 = uVar31 + (int)POPCOUNT(uVar40 ^ local_e98[0].amod.m._0_8_);
              iVar46 = (int)POPCOUNT(uVar40 ^ local_e98[0].amod.m._8_8_);
              uVar20 = iVar42 + iVar46;
              iVar42 = (int)POPCOUNT(uVar40 ^ local_e98[0].bs.m._0_8_);
              uVar27 = iVar13 + iVar42;
              if (uVar20 < uVar27) {
                uVar27 = uVar20;
              }
              uVar27 = uVar27 + (int)POPCOUNT(uVar22 ^ local_e98[0].amod.m._0_8_);
              uVar36 = iVar44 + iVar46;
              uVar20 = iVar12 + iVar42;
              if (uVar36 < uVar20) {
                uVar20 = uVar36;
              }
              uVar20 = uVar20 + (int)POPCOUNT(uVar34 ^ local_e98[0].amod.m._0_8_);
              if (uVar31 < uVar27) {
                uVar27 = uVar31;
              }
              if (uVar20 <= uVar27) {
                uVar27 = uVar20;
              }
              bVar4 = (byte)(uVar27 >> 1);
              local_c38[uVar39] = bVar4;
              if (0x7f < uVar27) {
                local_e98[0] = pVar19;
                __assert_fail("mismatch_counts[i] < BLOCK_MAX_KMEANS_TEXELS",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                              ,0x184,
                              "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                             );
              }
              if (bVar3 <= bVar4) {
                local_e98[0] = pVar19;
                __assert_fail("mismatch_counts[i] < bsd.texel_count",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                              ,0x185,
                              "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                             );
              }
              uVar39 = uVar39 + 1;
              puVar35 = puVar35 + 3;
            } while (uVar29 != uVar39);
          }
          else {
            local_f60._0_4_ = local_e98[0].amod.m[0];
            local_f60._4_4_ = local_e98[0].amod.m[1];
            local_f68._0_4_ = local_e98[0].amod.m[2];
            local_f68._4_4_ = local_e98[0].amod.m[3];
            local_f70._0_4_ = local_e98[0].bs.m[0];
            local_f70._4_4_ = local_e98[0].bs.m[1];
            local_e98[0].bs.m._8_8_ = pVar19.bs.m._8_8_;
            local_f78._0_4_ = local_e98[0].bs.m[2];
            local_f78._4_4_ = local_e98[0].bs.m[3];
            puVar35 = bsd->coverage_bitmaps_4[0] + 3;
            uVar39 = 0;
            do {
              local_fb8 = uVar39;
              uVar39 = (*(uint64_t (*) [4])(puVar35 + -3))[0];
              uVar40 = puVar35[-2];
              local_f38 = POPCOUNT(uVar39 ^ local_e98[0].amod.m._0_8_);
              local_f30 = POPCOUNT(uVar40 ^ local_e98[0].amod.m._0_8_);
              uVar22 = puVar35[-1];
              local_f90 = POPCOUNT(uVar22 ^ local_e98[0].amod.m._0_8_);
              uVar34 = *puVar35;
              local_fc0 = POPCOUNT(uVar34 ^ local_e98[0].amod.m._0_8_);
              local_f40 = POPCOUNT(uVar39 ^ local_e98[0].amod.m._8_8_);
              local_f48 = POPCOUNT(uVar40 ^ local_e98[0].amod.m._8_8_);
              local_f50 = POPCOUNT(uVar22 ^ local_e98[0].amod.m._8_8_);
              local_f58 = POPCOUNT(uVar39 ^ local_e98[0].bs.m._0_8_);
              iVar42 = (int)POPCOUNT(uVar22 ^ local_e98[0].bs.m._0_8_);
              iVar12 = (int)POPCOUNT(uVar34 ^ local_e98[0].bs.m._8_8_);
              iVar13 = (int)POPCOUNT(uVar34 ^ local_e98[0].bs.m._0_8_);
              iVar44 = (int)POPCOUNT(uVar22 ^ local_e98[0].bs.m._8_8_);
              uVar31 = iVar13 + iVar44;
              if ((uint)(iVar42 + iVar12) < (uint)(iVar13 + iVar44)) {
                uVar31 = iVar42 + iVar12;
              }
              iVar46 = (int)POPCOUNT(uVar40 ^ local_e98[0].bs.m._0_8_);
              iVar14 = (int)POPCOUNT(uVar40 ^ local_e98[0].bs.m._8_8_);
              uVar27 = iVar13 + iVar14;
              if ((uint)(iVar46 + iVar12) < (uint)(iVar13 + iVar14)) {
                uVar27 = iVar46 + iVar12;
              }
              uVar20 = iVar42 + iVar14;
              if ((uint)(iVar44 + iVar46) < (uint)(iVar42 + iVar14)) {
                uVar20 = iVar44 + iVar46;
              }
              iVar41 = (int)local_f58;
              iVar43 = (int)POPCOUNT(uVar39 ^ local_e98[0].bs.m._8_8_);
              uVar36 = iVar13 + iVar43;
              if ((uint)(iVar12 + iVar41) < (uint)(iVar13 + iVar43)) {
                uVar36 = iVar12 + iVar41;
              }
              uVar15 = iVar42 + iVar43;
              if ((uint)(iVar44 + iVar41) < (uint)(iVar42 + iVar43)) {
                uVar15 = iVar44 + iVar41;
              }
              uVar16 = iVar14 + iVar41;
              if ((uint)(iVar46 + iVar43) < (uint)(iVar14 + iVar41)) {
                uVar16 = iVar46 + iVar43;
              }
              iVar42 = (int)local_f48;
              iVar12 = (int)local_f50;
              uVar32 = uVar27 + iVar12;
              if (uVar31 + iVar42 < uVar27 + iVar12) {
                uVar32 = uVar31 + iVar42;
              }
              iVar13 = (int)POPCOUNT(uVar34 ^ local_e98[0].amod.m._8_8_);
              if (uVar20 + iVar13 <= uVar32) {
                uVar32 = uVar20 + iVar13;
              }
              iVar44 = (int)local_f40;
              uVar28 = uVar31 + iVar44;
              if (uVar36 + iVar12 <= uVar31 + iVar44) {
                uVar28 = uVar36 + iVar12;
              }
              if (uVar15 + iVar13 <= uVar28) {
                uVar28 = uVar15 + iVar13;
              }
              uVar31 = uVar27 + iVar44;
              if (uVar36 + iVar42 < uVar27 + iVar44) {
                uVar31 = uVar36 + iVar42;
              }
              if (iVar13 + uVar16 <= uVar31) {
                uVar31 = iVar13 + uVar16;
              }
              uVar27 = uVar16 + iVar12;
              if (uVar15 + iVar42 < uVar16 + iVar12) {
                uVar27 = uVar15 + iVar42;
              }
              if (uVar20 + iVar44 <= uVar27) {
                uVar27 = uVar20 + iVar44;
              }
              uVar20 = uVar28 + (int)local_f30;
              if (uVar32 + (int)local_f38 < uVar28 + (int)local_f30) {
                uVar20 = uVar32 + (int)local_f38;
              }
              uVar36 = uVar27 + (int)local_fc0;
              if (uVar31 + (int)local_f90 < uVar27 + (int)local_fc0) {
                uVar36 = uVar31 + (int)local_f90;
              }
              if (uVar20 < uVar36) {
                uVar36 = uVar20;
              }
              bVar4 = (byte)(uVar36 >> 1);
              local_c38[local_fb8] = bVar4;
              if (0x7f < uVar36) {
                local_e98[0] = pVar19;
                __assert_fail("mismatch_counts[i] < BLOCK_MAX_KMEANS_TEXELS",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                              ,0x18d,
                              "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                             );
              }
              if (bVar3 <= bVar4) {
                local_e98[0] = pVar19;
                __assert_fail("mismatch_counts[i] < bsd.texel_count",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                              ,0x18e,
                              "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                             );
              }
              puVar35 = puVar35 + 4;
              uVar39 = local_fb8 + 1;
            } while (uVar29 != local_fb8 + 1);
          }
        }
        local_ec8 = ZEXT432(0) << 0x20;
        local_ee8 = ZEXT432(0) << 0x20;
        local_f08 = ZEXT432(0) << 0x20;
        _local_f28 = ZEXT432(0) << 0x20;
        uVar39 = 0;
        local_e98[0] = pVar19;
        do {
          *(short *)(local_f28 + (ulong)(byte)local_c38[uVar39] * 2) =
               *(short *)(local_f28 + (ulong)(byte)local_c38[uVar39] * 2) + 1;
          uVar39 = uVar39 + 1;
        } while (uVar29 != uVar39);
        uVar39 = 0;
        sVar26 = 0;
        do {
          sVar5 = *(short *)(local_f28 + uVar39 * 2);
          *(short *)(local_f28 + uVar39 * 2) = sVar26;
          uVar39 = uVar39 + 1;
          sVar26 = sVar5 + sVar26;
        } while (local_f80 != uVar39);
        uVar39 = 1;
        if (1 < uVar38) {
          uVar39 = uVar29;
        }
        uVar40 = 0;
        do {
          uVar6 = *(ushort *)(local_f28 + (ulong)(byte)local_c38[uVar40] * 2);
          *(ushort *)(local_f28 + (ulong)(byte)local_c38[uVar40] * 2) = uVar6 + 1;
          *(short *)((long)&local_838 + (ulong)uVar6 * 2) = (short)uVar40;
          uVar40 = uVar40 + 1;
        } while (uVar39 != uVar40);
        if (uVar38 <= partition_search_limit) {
          local_fa8 = uVar29;
        }
        uVar31 = (uint)local_fa8;
        uVar38 = requested_candidates;
        if (uVar31 < requested_candidates) {
          uVar38 = uVar31;
        }
        auVar52 = vcmpps_avx(*(undefined1 (*) [16])(blk->data_max).m,
                             *(undefined1 (*) [16])(blk->data_min).m,0);
        auVar52 = vblendps_avx(ZEXT816(0),auVar52,8);
        uVar21 = vmovmskps_avx(auVar52);
        if (requested_candidates != 0) {
          uVar29 = (ulong)(uVar38 + (uVar38 == 0));
          lVar33 = uVar29 - 1;
          auVar74._8_8_ = lVar33;
          auVar74._0_8_ = lVar33;
          auVar74._16_8_ = lVar33;
          auVar74._24_8_ = lVar33;
          uVar39 = 0;
          auVar10 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          auVar11 = vpmovsxbq_avx2(ZEXT416(0x7060504));
          auVar69._8_8_ = 0x8000000000000000;
          auVar69._0_8_ = 0x8000000000000000;
          auVar69._16_8_ = 0x8000000000000000;
          auVar69._24_8_ = 0x8000000000000000;
          auVar9 = vpcmpeqd_avx2(ZEXT1632(auVar50),ZEXT1632(auVar50));
          auVar85._8_4_ = 0x7149f2ca;
          auVar85._0_8_ = 0x7149f2ca7149f2ca;
          auVar85._12_4_ = 0x7149f2ca;
          auVar85._16_4_ = 0x7149f2ca;
          auVar85._20_4_ = 0x7149f2ca;
          auVar85._24_4_ = 0x7149f2ca;
          auVar85._28_4_ = 0x7149f2ca;
          do {
            auVar91._8_8_ = uVar39;
            auVar91._0_8_ = uVar39;
            auVar91._16_8_ = uVar39;
            auVar91._24_8_ = uVar39;
            auVar92 = vpor_avx2(auVar91,auVar10);
            auVar91 = vpor_avx2(auVar91,auVar11);
            auVar91 = vpcmpgtq_avx2(auVar91 ^ auVar69,auVar74 ^ auVar69);
            auVar92 = vpcmpgtq_avx2(auVar92 ^ auVar69,auVar74 ^ auVar69);
            auVar91 = vpackssdw_avx2(auVar92,auVar91);
            auVar50 = vpackssdw_avx(SUB3216(auVar91 ^ auVar9,0),SUB3216(auVar91 ^ auVar9,0x10));
            auVar50 = vpshufd_avx(auVar50,0xd8);
            auVar91 = vpmovzxwd_avx2(auVar50);
            auVar92 = vpslld_avx2(auVar91,0x1f);
            auVar91 = vmaskmovps_avx(auVar92,auVar85);
            *(undefined1 (*) [32])(local_d38 + uVar39) = auVar91;
            auVar91 = vmaskmovps_avx(auVar92,auVar85);
            *(undefined1 (*) [32])(local_d58 + (uVar39 - 8)) = auVar91;
            uVar39 = uVar39 + 8;
          } while ((uVar29 + 7 & 0xfffffffffffffff8) != uVar39);
        }
        local_fb0 = CONCAT44(local_fb0._4_4_,fVar51 * fVar51);
        uVar27 = partition_count + (partition_count == 0);
        local_fa8 = (ulong)(uVar31 + (uVar31 == 0));
        if ((char)uVar21 == '\0') {
          local_fc0 = (ulong)uVar27;
          lVar33 = local_fc0 * 4;
          uVar29 = 0;
          do {
            uVar6 = *(ushort *)((long)&local_838 + uVar29 * 2);
            ppVar24 = block_size_descriptor::get_raw_partition_info
                                (local_f98,(uint)local_fd0,(uint)uVar6);
            compute_avgs_and_dirs_4_comp(ppVar24,blk,(partition_metrics *)local_c38);
            lVar25 = 0x10;
            auVar50._8_4_ = 0x3f000000;
            auVar50._0_8_ = 0x3f0000003f000000;
            auVar50._12_4_ = 0x3f000000;
            uVar39 = local_fc0;
            do {
              uVar17 = *(undefined8 *)((long)auStack_c48 + lVar25 + 8);
              *(undefined8 *)((long)auStack_d28 + lVar25) =
                   *(undefined8 *)((long)auStack_c48 + lVar25);
              *(undefined8 *)((long)auStack_d28 + lVar25 + 8) = uVar17;
              auVar52 = *(undefined1 (*) [16])((long)auStack_c48 + lVar25);
              auVar86 = *(undefined1 (*) [16])(local_c38 + lVar25);
              auVar64._0_4_ = auVar86._0_4_ * auVar86._0_4_;
              auVar64._4_4_ = auVar86._4_4_ * auVar86._4_4_;
              auVar64._8_4_ = auVar86._8_4_ * auVar86._8_4_;
              auVar64._12_4_ = auVar86._12_4_ * auVar86._12_4_;
              auVar87 = vshufpd_avx(auVar64,auVar64,1);
              auVar65._0_4_ = auVar64._0_4_ + auVar87._0_4_;
              auVar65._4_4_ = auVar64._4_4_ + auVar87._4_4_;
              auVar65._8_4_ = auVar64._8_4_ + auVar87._8_4_;
              auVar65._12_4_ = auVar64._12_4_ + auVar87._12_4_;
              auVar87 = vhaddps_avx(auVar65,auVar65);
              fVar51 = auVar87._0_4_;
              auVar71._4_4_ = fVar51;
              auVar71._0_4_ = fVar51;
              auVar71._8_4_ = fVar51;
              auVar71._12_4_ = fVar51;
              auVar87 = vsqrtps_avx(auVar71);
              auVar86 = vdivps_avx(auVar86,auVar87);
              if ((fVar51 == 0.0) && (!NAN(fVar51))) {
                auVar86 = auVar50;
              }
              *(undefined1 (*) [16])((long)local_d18[0].avg.m + lVar25) = auVar86;
              auVar87 = *(undefined1 (*) [16])((long)auStack_d28 + lVar25);
              auVar72._0_4_ = auVar87._0_4_ * auVar86._0_4_;
              auVar72._4_4_ = auVar87._4_4_ * auVar86._4_4_;
              auVar72._8_4_ = auVar87._8_4_ * auVar86._8_4_;
              auVar72._12_4_ = auVar87._12_4_ * auVar86._12_4_;
              auVar88 = vshufpd_avx(auVar72,auVar72,1);
              auVar73._0_4_ = auVar72._0_4_ + auVar88._0_4_;
              auVar73._4_4_ = auVar72._4_4_ + auVar88._4_4_;
              auVar73._8_4_ = auVar72._8_4_ + auVar88._8_4_;
              auVar73._12_4_ = auVar72._12_4_ + auVar88._12_4_;
              auVar88 = vhaddps_avx(auVar73,auVar73);
              fVar51 = auVar88._0_4_;
              auVar55._0_4_ = auVar86._0_4_ * fVar51;
              auVar55._4_4_ = auVar86._4_4_ * fVar51;
              auVar55._8_4_ = auVar86._8_4_ * fVar51;
              auVar55._12_4_ = auVar86._12_4_ * fVar51;
              auVar86 = vsubps_avx(auVar87,auVar55);
              *(undefined1 (*) [16])(auStack_e28 + lVar25) = auVar86;
              uVar17 = *(undefined8 *)((long)local_d18[0].avg.m + lVar25 + 8);
              *(undefined8 *)(local_e18 + lVar25) =
                   *(undefined8 *)((long)local_d18[0].avg.m + lVar25);
              *(undefined8 *)((long)afStack_e10 + lVar25) = uVar17;
              *(undefined8 *)((long)&local_f38 + lVar25) = 0;
              *(undefined8 *)(local_f28 + lVar25 + -8) = 0;
              auVar56._0_4_ = auVar52._0_4_ * auVar52._0_4_;
              auVar56._4_4_ = auVar52._4_4_ * auVar52._4_4_;
              auVar56._8_4_ = auVar52._8_4_ * auVar52._8_4_;
              auVar56._12_4_ = auVar52._12_4_ * auVar52._12_4_;
              auVar86 = vshufpd_avx(auVar56,auVar56,1);
              auVar57._0_4_ = auVar56._0_4_ + auVar86._0_4_;
              auVar57._4_4_ = auVar56._4_4_ + auVar86._4_4_;
              auVar57._8_4_ = auVar56._8_4_ + auVar86._8_4_;
              auVar57._12_4_ = auVar56._12_4_ + auVar86._12_4_;
              auVar86 = vhaddps_avx(auVar57,auVar57);
              fVar51 = auVar86._0_4_;
              auVar66._4_4_ = fVar51;
              auVar66._0_4_ = fVar51;
              auVar66._8_4_ = fVar51;
              auVar66._12_4_ = fVar51;
              auVar86 = vsqrtps_avx(auVar66);
              auVar52 = vdivps_avx(auVar52,auVar86);
              if ((fVar51 == 0.0) && (!NAN(fVar51))) {
                auVar52 = auVar50;
              }
              *(undefined1 (*) [16])(local_f28 + lVar25) = auVar52;
              *(undefined8 *)((long)local_ea8 + lVar25) = 0;
              *(undefined8 *)((long)&uStack_ea0 + lVar25) = 0;
              uVar17 = *(undefined8 *)((long)&uStack_f20 + lVar25);
              *(undefined8 *)((long)local_e98[0].amod.m + lVar25) =
                   *(undefined8 *)(local_f28 + lVar25);
              *(undefined8 *)((long)local_e98[0].amod.m + lVar25 + 8) = uVar17;
              lVar25 = lVar25 + 0x20;
              uVar39 = uVar39 - 1;
            } while (uVar39 != 0);
            local_fc4 = 0.0;
            local_fd4 = 0.0;
            compute_error_squared_rgba
                      (ppVar24,blk,(processed_line4 *)local_e18,local_e98,local_ea8,&local_fc4,
                       &local_fd4);
            puVar45 = ppVar24->partition_texel_count;
            lVar25 = 0;
            do {
              fVar7 = (float)local_fb0 * (float)*puVar45;
              fVar51 = *(float *)((long)local_ea8 + lVar25);
              fVar75 = fVar51 * local_d18[0].dir.m[lVar25 * 2];
              fVar82 = fVar51 * local_d18[0].dir.m[lVar25 * 2 + 1];
              fVar77 = fVar51 * local_d18[0].dir.m[lVar25 * 2 + 2];
              fVar81 = fVar51 * local_d18[0].dir.m[lVar25 * 2 + 3];
              auVar79._0_4_ = fVar7 * fVar75 * fVar75;
              auVar79._4_4_ = fVar7 * fVar82 * fVar82;
              auVar79._8_4_ = fVar7 * fVar77 * fVar77;
              auVar79._12_4_ = fVar7 * fVar81 * fVar81;
              auVar50 = vshufpd_avx(auVar79,auVar79,1);
              auVar80._0_4_ = auVar79._0_4_ + auVar50._0_4_;
              auVar80._4_4_ = auVar79._4_4_ + auVar50._4_4_;
              auVar80._8_4_ = auVar79._8_4_ + auVar50._8_4_;
              auVar80._12_4_ = auVar79._12_4_ + auVar50._12_4_;
              auVar50 = vhaddps_avx(auVar80,auVar80);
              local_fc4 = local_fc4 + auVar50._0_4_;
              auVar67._0_4_ =
                   fVar7 * fVar51 * afStack_f18[lVar25 * 2] * fVar51 * afStack_f18[lVar25 * 2];
              auVar67._4_4_ =
                   fVar7 * fVar51 * afStack_f18[lVar25 * 2 + 1] *
                           fVar51 * afStack_f18[lVar25 * 2 + 1];
              auVar67._8_4_ =
                   fVar7 * fVar51 * *(float *)(local_f08 + lVar25 * 8 + -8) *
                           fVar51 * *(float *)(local_f08 + lVar25 * 8 + -8);
              auVar67._12_4_ =
                   fVar7 * fVar51 * *(float *)(local_f08 + lVar25 * 8 + -4) *
                           fVar51 * *(float *)(local_f08 + lVar25 * 8 + -4);
              auVar50 = vshufpd_avx(auVar67,auVar67,1);
              auVar68._0_4_ = auVar67._0_4_ + auVar50._0_4_;
              auVar68._4_4_ = auVar67._4_4_ + auVar50._4_4_;
              auVar68._8_4_ = auVar67._8_4_ + auVar50._8_4_;
              auVar68._12_4_ = auVar67._12_4_ + auVar50._12_4_;
              auVar50 = vhaddps_avx(auVar68,auVar68);
              local_fd4 = local_fd4 + auVar50._0_4_;
              puVar45 = puVar45 + 1;
              lVar25 = lVar25 + 4;
            } while (lVar33 - lVar25 != 0);
            insert_result(uVar38,local_fc4,(uint)uVar6,local_d38,local_d58);
            insert_result(uVar38,local_fd4,(uint)uVar6,local_d78,local_d98);
            uVar29 = uVar29 + 1;
          } while (uVar29 != local_fa8);
        }
        else {
          lVar33 = (ulong)uVar27 * 0x90;
          uVar29 = 0;
          local_fb8 = CONCAT44(local_fb8._4_4_,uVar38);
          do {
            uVar6 = *(ushort *)((long)&local_838 + uVar29 * 2);
            ppVar24 = block_size_descriptor::get_raw_partition_info
                                (local_f98,(uint)local_fd0,(uint)uVar6);
            pm_00 = local_d18;
            compute_avgs_and_dirs_3_comp_rgb(ppVar24,blk,pm_00);
            lVar25 = 0;
            do {
              uVar17 = *(undefined8 *)((pm_00->avg).m + 2);
              *(undefined8 *)(local_c38 + lVar25) = *(undefined8 *)(pm_00->avg).m;
              *(undefined8 *)((long)afStack_c28 + lVar25 + -8) = uVar17;
              auVar50 = *(undefined1 (*) [16])(pm_00->dir).m;
              auVar53._0_4_ = auVar50._0_4_ * auVar50._0_4_;
              auVar53._4_4_ = auVar50._4_4_ * auVar50._4_4_;
              auVar53._8_4_ = auVar50._8_4_ * auVar50._8_4_;
              auVar53._12_4_ = auVar50._12_4_ * auVar50._12_4_;
              auVar52 = vshufpd_avx(auVar53,auVar53,1);
              auVar54._0_4_ = auVar53._0_4_ + auVar52._0_4_;
              auVar54._4_4_ = auVar53._4_4_ + auVar52._4_4_;
              auVar54._8_4_ = auVar53._8_4_ + auVar52._8_4_;
              auVar54._12_4_ = auVar53._12_4_ + auVar52._12_4_;
              auVar52 = vhaddps_avx(auVar54,auVar54);
              fVar51 = auVar52._0_4_;
              auVar58._4_4_ = fVar51;
              auVar58._0_4_ = fVar51;
              auVar58._8_4_ = fVar51;
              auVar58._12_4_ = fVar51;
              auVar52 = vsqrtps_avx(auVar58);
              auVar50 = vdivps_avx(auVar50,auVar52);
              if ((fVar51 == 0.0) && (!NAN(fVar51))) {
                auVar50 = _DAT_00332870;
              }
              *(undefined1 (*) [16])((long)afStack_c28 + lVar25) = auVar50;
              *(undefined8 *)((long)local_c18.a.m + lVar25) = 0;
              *(undefined8 *)((long)local_c18.a.m + lVar25 + 8) = 0;
              auVar52 = *(undefined1 (*) [16])(pm_00->avg).m;
              auVar59._0_4_ = auVar52._0_4_ * auVar52._0_4_;
              auVar59._4_4_ = auVar52._4_4_ * auVar52._4_4_;
              auVar59._8_4_ = auVar52._8_4_ * auVar52._8_4_;
              auVar59._12_4_ = auVar52._12_4_ * auVar52._12_4_;
              auVar86 = vshufpd_avx(auVar59,auVar59,1);
              auVar60._0_4_ = auVar59._0_4_ + auVar86._0_4_;
              auVar60._4_4_ = auVar59._4_4_ + auVar86._4_4_;
              auVar60._8_4_ = auVar59._8_4_ + auVar86._8_4_;
              auVar60._12_4_ = auVar59._12_4_ + auVar86._12_4_;
              auVar86 = vhaddps_avx(auVar60,auVar60);
              fVar51 = auVar86._0_4_;
              auVar70._4_4_ = fVar51;
              auVar70._0_4_ = fVar51;
              auVar70._8_4_ = fVar51;
              auVar70._12_4_ = fVar51;
              auVar86 = vsqrtps_avx(auVar70);
              auVar52 = vdivps_avx(auVar52,auVar86);
              if ((fVar51 == 0.0) && (!NAN(fVar51))) {
                auVar52 = _DAT_00332870;
              }
              *(undefined1 (*) [16])((long)local_c18.b.m + lVar25) = auVar52;
              auVar52 = *(undefined1 (*) [16])(local_c38 + lVar25);
              auVar61._0_4_ = auVar52._0_4_ * auVar50._0_4_;
              auVar61._4_4_ = auVar52._4_4_ * auVar50._4_4_;
              auVar61._8_4_ = auVar52._8_4_ * auVar50._8_4_;
              auVar61._12_4_ = auVar52._12_4_ * auVar50._12_4_;
              auVar86 = vhaddps_avx(auVar61,auVar61);
              auVar87 = vshufpd_avx(auVar61,auVar61,1);
              auVar62._0_4_ = auVar87._0_4_ + auVar86._0_4_;
              auVar62._4_4_ = auVar87._4_4_ + auVar86._4_4_;
              auVar62._8_8_ = 0;
              auVar86 = vpshufd_avx(auVar62,0xc0);
              auVar49._0_4_ = auVar50._0_4_ * auVar86._0_4_;
              auVar49._4_4_ = auVar50._4_4_ * auVar86._4_4_;
              auVar49._8_4_ = auVar50._8_4_ * auVar86._8_4_;
              auVar49._12_4_ = auVar50._12_4_ * auVar86._12_4_;
              auVar50 = vsubps_avx(auVar52,auVar49);
              *(undefined1 (*) [16])((long)local_bf8.amod.m + lVar25) = auVar50;
              uVar17 = *(undefined8 *)((long)&uStack_c20 + lVar25);
              *(undefined8 *)((long)local_bf8.bs.m + lVar25) =
                   *(undefined8 *)((long)afStack_c28 + lVar25);
              *(undefined8 *)((long)local_bf8.bs.m + lVar25 + 8) = uVar17;
              *(undefined8 *)((long)local_bd8.amod.m + lVar25) = 0;
              *(undefined8 *)((long)local_bd8.amod.m + lVar25 + 8) = 0;
              uVar17 = *(undefined8 *)((long)local_c18.b.m + lVar25 + 8);
              *(undefined8 *)((long)local_bd8.bs.m + lVar25) =
                   *(undefined8 *)((long)local_c18.b.m + lVar25);
              *(undefined8 *)((long)local_bd8.bs.m + lVar25 + 8) = uVar17;
              pm_00 = pm_00 + 1;
              lVar25 = lVar25 + 0x90;
            } while (lVar33 != lVar25);
            auVar10._28_4_ = 0;
            auVar10._0_28_ = stack0xfffffffffffff0dc;
            _local_f28 = auVar10 << 0x20;
            auVar18._12_4_ = 0;
            auVar18._0_12_ = stack0xfffffffffffff1ec;
            _local_e18 = (__m128)(auVar18 << 0x20);
            compute_error_squared_rgb
                      (ppVar24,blk,(partition_lines3 *)local_c38,(float *)local_f28,
                       (float *)local_e18);
            puVar45 = ppVar24->partition_texel_count;
            lVar25 = 0;
            uVar38 = (uint)local_fb8;
            fVar51 = (float)local_f28._0_4_;
            fVar7 = (float)local_e18._0_4_;
            do {
              fVar82 = (float)local_fb0 * (float)*puVar45;
              fVar75 = *(float *)((long)afStack_bb8 + lVar25);
              fVar77 = fVar75 * *(float *)((long)afStack_c28 + lVar25);
              fVar81 = fVar75 * *(float *)((long)afStack_c28 + lVar25 + 4);
              fVar83 = fVar75 * *(float *)((long)&uStack_c20 + lVar25);
              fVar84 = fVar75 * *(float *)((long)local_c18.a.m + lVar25 + -4);
              auVar78._0_4_ = fVar82 * fVar77 * fVar77;
              auVar78._4_4_ = fVar82 * fVar81 * fVar81;
              auVar78._8_4_ = fVar82 * fVar83 * fVar83;
              auVar78._12_4_ = fVar82 * fVar84 * fVar84;
              auVar50 = vhaddps_avx(auVar78,auVar78);
              fVar77 = fVar75 * *(float *)((long)local_c18.b.m + lVar25);
              fVar81 = fVar75 * *(float *)((long)local_c18.b.m + lVar25 + 4);
              fVar83 = fVar75 * *(float *)((long)local_c18.b.m + lVar25 + 8);
              fVar75 = fVar75 * *(float *)((long)local_c18.b.m + lVar25 + 0xc);
              auVar86 = vshufpd_avx(auVar78,auVar78,1);
              auVar63._0_4_ = fVar82 * fVar77 * fVar77;
              auVar63._4_4_ = fVar82 * fVar81 * fVar81;
              auVar63._8_4_ = fVar82 * fVar83 * fVar83;
              auVar63._12_4_ = fVar82 * fVar75 * fVar75;
              auVar52 = vhaddps_avx(auVar63,auVar63);
              fVar51 = fVar51 + auVar86._0_4_ + auVar50._0_4_;
              auVar50 = vshufpd_avx(auVar63,auVar63,1);
              fVar7 = fVar7 + auVar50._0_4_ + auVar52._0_4_;
              lVar25 = lVar25 + 0x90;
              puVar45 = puVar45 + 1;
            } while (lVar33 != lVar25);
            local_f28._0_4_ = fVar51;
            local_e18._0_4_ = fVar7;
            insert_result((uint)local_fb8,fVar51,(uint)uVar6,local_d38,local_d58);
            insert_result(uVar38,(float)local_e18._0_4_,(uint)uVar6,local_d78,local_d98);
            uVar29 = uVar29 + 1;
          } while (uVar29 != local_fa8);
        }
        this = local_f98;
        uVar17 = local_fd0;
        if (local_f9c != 0) {
          uVar29 = 0;
          do {
            ppVar24 = block_size_descriptor::get_raw_partition_info
                                (this,(uint)uVar17,*(uint *)((long)local_d58 + uVar29 * 2));
            local_d18[0].avg.m[uVar29 & 0xffffffff] = (float)(uint)ppVar24->partition_index;
            ppVar24 = block_size_descriptor::get_raw_partition_info
                                (this,(uint)uVar17,*(uint *)((long)local_d98 + uVar29 * 2));
            local_d18[0].avg.m[(int)uVar29 + 1] = (float)(uint)ppVar24->partition_index;
            uVar29 = uVar29 + 2;
          } while ((ulong)(uVar38 + (uVar38 == 0)) * 2 != uVar29);
        }
        auVar50 = ZEXT816(0) << 0x40;
        local_bd8 = (processed_line3)ZEXT1632(auVar50);
        local_bf8 = (processed_line3)ZEXT1632(auVar50);
        local_c18 = (line3)ZEXT1632(auVar50);
        _local_c38 = (line3)ZEXT1632(auVar50);
        if (uVar38 * 2 == 0) {
          uVar31 = 0;
        }
        else {
          uVar31 = 0;
          lVar33 = 0;
          do {
            fVar51 = local_d18[0].avg.m[lVar33];
            uVar29 = *(ulong *)(local_c38 + (ulong)((uint)fVar51 >> 6) * 8);
            if ((uVar29 >> ((ulong)(uint)fVar51 & 0x3f) & 1) == 0) {
              local_f88[uVar31] = (uint)fVar51;
              *(ulong *)(local_c38 + (ulong)((uint)fVar51 >> 6) * 8) =
                   1L << (SUB41(fVar51,0) & 0x3f) | uVar29;
              uVar31 = uVar31 + 1;
              bVar48 = uVar31 == uVar38;
            }
            else {
              bVar48 = false;
            }
          } while ((!bVar48) &&
                  (bVar48 = (ulong)(uVar38 * 2) - 1 != lVar33, lVar33 = lVar33 + 1, bVar48));
        }
        return uVar31;
      }
      __assert_fail("active_count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                    ,0x174,
                    "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                   );
    }
  } while( true );
}

Assistant:

unsigned int find_best_partition_candidates(
	const block_size_descriptor& bsd,
	const image_block& blk,
	unsigned int partition_count,
	unsigned int partition_search_limit,
	unsigned int best_partitions[TUNE_MAX_PARTITIONING_CANDIDATES],
	unsigned int requested_candidates
) {
	// Constant used to estimate quantization error for a given partitioning; the optimal value for
	// this depends on bitrate. These values have been determined empirically.
	unsigned int texels_per_block = bsd.texel_count;
	float weight_imprecision_estim = 0.055f;
	if (texels_per_block <= 20)
	{
		weight_imprecision_estim = 0.03f;
	}
	else if (texels_per_block <= 31)
	{
		weight_imprecision_estim = 0.04f;
	}
	else if (texels_per_block <= 41)
	{
		weight_imprecision_estim = 0.05f;
	}

	promise(partition_count > 0);
	promise(partition_search_limit > 0);

	weight_imprecision_estim = weight_imprecision_estim * weight_imprecision_estim;

	uint16_t partition_sequence[BLOCK_MAX_PARTITIONINGS];
	unsigned int sequence_len = compute_kmeans_partition_ordering(bsd, blk, partition_count, partition_sequence);
	partition_search_limit = astc::min(partition_search_limit, sequence_len);
	requested_candidates = astc::min(partition_search_limit, requested_candidates);

	bool uses_alpha = !blk.is_constant_channel(3);

	// Partitioning errors assuming uncorrelated-chrominance endpoints
	float uncor_best_errors[TUNE_MAX_PARTITIONING_CANDIDATES];
	unsigned int uncor_best_partitions[TUNE_MAX_PARTITIONING_CANDIDATES];

	// Partitioning errors assuming same-chrominance endpoints
	float samec_best_errors[TUNE_MAX_PARTITIONING_CANDIDATES];
	unsigned int samec_best_partitions[TUNE_MAX_PARTITIONING_CANDIDATES];

	for (unsigned int i = 0; i < requested_candidates; i++)
	{
		uncor_best_errors[i] = ERROR_CALC_DEFAULT;
		samec_best_errors[i] = ERROR_CALC_DEFAULT;
	}

	if (uses_alpha)
	{
		for (unsigned int i = 0; i < partition_search_limit; i++)
		{
			unsigned int partition = partition_sequence[i];
			const auto& pi = bsd.get_raw_partition_info(partition_count, partition);

			// Compute weighting to give to each component in each partition
			partition_metrics pms[BLOCK_MAX_PARTITIONS];

			compute_avgs_and_dirs_4_comp(pi, blk, pms);

			line4 uncor_lines[BLOCK_MAX_PARTITIONS];
			line4 samec_lines[BLOCK_MAX_PARTITIONS];

			processed_line4 uncor_plines[BLOCK_MAX_PARTITIONS];
			processed_line4 samec_plines[BLOCK_MAX_PARTITIONS];

			float line_lengths[BLOCK_MAX_PARTITIONS];

			for (unsigned int j = 0; j < partition_count; j++)
			{
				partition_metrics& pm = pms[j];

				uncor_lines[j].a = pm.avg;
				uncor_lines[j].b = normalize_safe(pm.dir, unit4());

				uncor_plines[j].amod = uncor_lines[j].a - uncor_lines[j].b * dot(uncor_lines[j].a, uncor_lines[j].b);
				uncor_plines[j].bs = uncor_lines[j].b;

				samec_lines[j].a = vfloat4::zero();
				samec_lines[j].b = normalize_safe(pm.avg, unit4());

				samec_plines[j].amod = vfloat4::zero();
				samec_plines[j].bs = samec_lines[j].b;
			}

			float uncor_error = 0.0f;
			float samec_error = 0.0f;

			compute_error_squared_rgba(pi,
			                           blk,
			                           uncor_plines,
			                           samec_plines,
			                           line_lengths,
			                           uncor_error,
			                           samec_error);

			// Compute an estimate of error introduced by weight quantization imprecision.
			// This error is computed as follows, for each partition
			//     1: compute the principal-axis vector (full length) in error-space
			//     2: convert the principal-axis vector to regular RGB-space
			//     3: scale the vector by a constant that estimates average quantization error
			//     4: for each texel, square the vector, then do a dot-product with the texel's
			//        error weight; sum up the results across all texels.
			//     4(optimized): square the vector once, then do a dot-product with the average
			//        texel error, then multiply by the number of texels.

			for (unsigned int j = 0; j < partition_count; j++)
			{
				float tpp = static_cast<float>(pi.partition_texel_count[j]);
				vfloat4 error_weights(tpp * weight_imprecision_estim);

				vfloat4 uncor_vector = uncor_lines[j].b * line_lengths[j];
				vfloat4 samec_vector = samec_lines[j].b * line_lengths[j];

				uncor_error += dot_s(uncor_vector * uncor_vector, error_weights);
				samec_error += dot_s(samec_vector * samec_vector, error_weights);
			}

			insert_result(requested_candidates, uncor_error, partition, uncor_best_errors, uncor_best_partitions);
			insert_result(requested_candidates, samec_error, partition, samec_best_errors, samec_best_partitions);
		}
	}
	else
	{
		for (unsigned int i = 0; i < partition_search_limit; i++)
		{
			unsigned int partition = partition_sequence[i];
			const auto& pi = bsd.get_raw_partition_info(partition_count, partition);

			// Compute weighting to give to each component in each partition
			partition_metrics pms[BLOCK_MAX_PARTITIONS];
			compute_avgs_and_dirs_3_comp_rgb(pi, blk, pms);

			partition_lines3 plines[BLOCK_MAX_PARTITIONS];

			for (unsigned int j = 0; j < partition_count; j++)
			{
				partition_metrics& pm = pms[j];
				partition_lines3& pl = plines[j];

				pl.uncor_line.a = pm.avg;
				pl.uncor_line.b = normalize_safe(pm.dir, unit3());

				pl.samec_line.a = vfloat4::zero();
				pl.samec_line.b = normalize_safe(pm.avg, unit3());

				pl.uncor_pline.amod = pl.uncor_line.a - pl.uncor_line.b * dot3(pl.uncor_line.a, pl.uncor_line.b);
				pl.uncor_pline.bs   = pl.uncor_line.b;

				pl.samec_pline.amod = vfloat4::zero();
				pl.samec_pline.bs   = pl.samec_line.b;
			}

			float uncor_error = 0.0f;
			float samec_error = 0.0f;

			compute_error_squared_rgb(pi,
			                          blk,
			                          plines,
			                          uncor_error,
			                          samec_error);

			// Compute an estimate of error introduced by weight quantization imprecision.
			// This error is computed as follows, for each partition
			//     1: compute the principal-axis vector (full length) in error-space
			//     2: convert the principal-axis vector to regular RGB-space
			//     3: scale the vector by a constant that estimates average quantization error
			//     4: for each texel, square the vector, then do a dot-product with the texel's
			//        error weight; sum up the results across all texels.
			//     4(optimized): square the vector once, then do a dot-product with the average
			//        texel error, then multiply by the number of texels.

			for (unsigned int j = 0; j < partition_count; j++)
			{
				partition_lines3& pl = plines[j];

				float tpp = static_cast<float>(pi.partition_texel_count[j]);
				vfloat4 error_weights(tpp * weight_imprecision_estim);

				vfloat4 uncor_vector = pl.uncor_line.b * pl.line_length;
				vfloat4 samec_vector = pl.samec_line.b * pl.line_length;

				uncor_error += dot3_s(uncor_vector * uncor_vector, error_weights);
				samec_error += dot3_s(samec_vector * samec_vector, error_weights);
			}

			insert_result(requested_candidates, uncor_error, partition, uncor_best_errors, uncor_best_partitions);
			insert_result(requested_candidates, samec_error, partition, samec_best_errors, samec_best_partitions);
		}
	}

	unsigned int interleave[2 * TUNE_MAX_PARTITIONING_CANDIDATES];
	for (unsigned int i = 0; i < requested_candidates; i++)
	{
		interleave[2 * i] = bsd.get_raw_partition_info(partition_count, uncor_best_partitions[i]).partition_index;
		interleave[2 * i + 1] = bsd.get_raw_partition_info(partition_count, samec_best_partitions[i]).partition_index;
	}

	uint64_t bitmasks[1024/64] { 0 };
	unsigned int emitted = 0;

	// Deduplicate the first "requested" entries
	for (unsigned int i = 0; i < requested_candidates * 2;  i++)
	{
		unsigned int partition = interleave[i];

		unsigned int word = partition / 64;
		unsigned int bit = partition % 64;

		bool written = bitmasks[word] & (1ull << bit);

		if (!written)
		{
			best_partitions[emitted] = partition;
			bitmasks[word] |= 1ull << bit;
			emitted++;

			if (emitted == requested_candidates)
			{
				break;
			}
		}
	}

	return emitted;
}